

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
wasm::Builder::makeFunction
          (Name name,vector<wasm::NameType,_std::allocator<wasm::NameType>_> *params,HeapType type,
          vector<wasm::NameType,_std::allocator<wasm::NameType>_> *vars,Expression *body)

{
  reference pNVar1;
  reference pvVar2;
  NameType *pNVar3;
  Expression *this;
  bool bVar4;
  pointer pFVar5;
  NameType *pNVar6;
  Type *this_00;
  size_type sVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  __uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> this_01;
  Expression *in_stack_00000008;
  mapped_type local_94;
  reference pNStack_90;
  Index index_1;
  NameType *var;
  iterator __end2;
  iterator __begin2;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> *__range2;
  Type TStack_68;
  Index index;
  reference local_60;
  NameType *param;
  size_t i;
  undefined1 local_39;
  Expression *local_38;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> *vars_local;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> *params_local;
  HeapType type_local;
  Name name_local;
  __single_object *func;
  
  type_local.id = name.super_IString.str._M_str;
  this_01.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl = name.super_IString.str._M_len;
  local_38 = body;
  vars_local = (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)type.id;
  params_local = vars;
  bVar4 = HeapType::isSignature((HeapType *)&params_local);
  if (!bVar4) {
    __assert_fail("type.isSignature()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                  ,0x40,
                  "static std::unique_ptr<Function> wasm::Builder::makeFunction(Name, std::vector<NameType> &&, HeapType, std::vector<NameType> &&, Expression *)"
                 );
  }
  local_39 = 0;
  std::make_unique<wasm::Function>();
  pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                      this_01.
                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
  wasm::Name::operator=((Name *)pFVar5,(Name *)&type_local);
  pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                      this_01.
                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
  (pFVar5->type).id = (uintptr_t)params_local;
  pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                      this_01.
                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
  pFVar5->body = in_stack_00000008;
  param = (NameType *)0x0;
  while( true ) {
    pNVar3 = param;
    pNVar6 = (NameType *)
             std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::size(vars_local);
    this = local_38;
    if (pNVar6 <= pNVar3) {
      __end2 = std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::begin
                         ((vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_38);
      var = (NameType *)
            std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::end
                      ((vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)this);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<wasm::NameType_*,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
                                         *)&var), bVar4) {
        pNStack_90 = __gnu_cxx::
                     __normal_iterator<wasm::NameType_*,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
                     ::operator*(&__end2);
        pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                           ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                            this_01.
                            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                            .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                  (&pFVar5->vars,&pNStack_90->type);
        pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                           ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                            this_01.
                            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                            .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
        sVar7 = std::
                unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                ::size(&pFVar5->localNames);
        local_94 = (mapped_type)sVar7;
        pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                           ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                            this_01.
                            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                            .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
        pmVar8 = std::
                 unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                 ::operator[](&pFVar5->localIndices,&pNStack_90->name);
        pNVar1 = pNStack_90;
        *pmVar8 = (mapped_type)sVar7;
        pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                           ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                            this_01.
                            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                            .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
        pmVar9 = std::
                 unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                 ::operator[](&pFVar5->localNames,&local_94);
        wasm::Name::operator=(pmVar9,&pNVar1->name);
        __gnu_cxx::
        __normal_iterator<wasm::NameType_*,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
        ::operator++(&__end2);
      }
      return (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
             (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
             this_01.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    }
    local_60 = std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::operator[]
                         (vars_local,(size_type)param);
    pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                        this_01.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    TStack_68 = Function::getParams(pFVar5);
    this_00 = wasm::Type::operator[](&stack0xffffffffffffff98,(size_t)param);
    bVar4 = wasm::Type::operator==(this_00,&local_60->type);
    if (!bVar4) break;
    pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                        this_01.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    sVar7 = std::
            unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
            ::size(&pFVar5->localNames);
    __range2._4_4_ = (mapped_type)sVar7;
    pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                        this_01.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    pmVar8 = std::
             unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
             ::operator[](&pFVar5->localIndices,&local_60->name);
    pvVar2 = local_60;
    *pmVar8 = (mapped_type)sVar7;
    pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                        this_01.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    pmVar9 = std::
             unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
             ::operator[](&pFVar5->localNames,(key_type *)((long)&__range2 + 4));
    wasm::Name::operator=(pmVar9,&pvVar2->name);
    param = (NameType *)((long)&(param->name).super_IString.str._M_len + 1);
  }
  __assert_fail("func->getParams()[i] == param.type",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                ,0x47,
                "static std::unique_ptr<Function> wasm::Builder::makeFunction(Name, std::vector<NameType> &&, HeapType, std::vector<NameType> &&, Expression *)"
               );
}

Assistant:

static std::unique_ptr<Function> makeFunction(Name name,
                                                std::vector<NameType>&& params,
                                                HeapType type,
                                                std::vector<NameType>&& vars,
                                                Expression* body = nullptr) {
    assert(type.isSignature());
    auto func = std::make_unique<Function>();
    func->name = name;
    func->type = type;
    func->body = body;
    for (size_t i = 0; i < params.size(); ++i) {
      NameType& param = params[i];
      assert(func->getParams()[i] == param.type);
      Index index = func->localNames.size();
      func->localIndices[param.name] = index;
      func->localNames[index] = param.name;
    }
    for (auto& var : vars) {
      func->vars.push_back(var.type);
      Index index = func->localNames.size();
      func->localIndices[var.name] = index;
      func->localNames[index] = var.name;
    }
    return func;
  }